

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileDaily.cpp
# Opt level: O2

void __thiscall liblogger::LogFileDaily::Log(LogFileDaily *this,LogType Type,string *str)

{
  string *__lhs;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  FILE *pFVar6;
  string *psVar7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  LogException *pLVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  string cname;
  time_t current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  stringstream ss;
  ostream local_668 [376];
  tm timeinfo;
  char buf [128];
  char fname [1024];
  
  current = time((time_t *)0x0);
  localtime_r(&current,(tm *)&timeinfo);
  sVar5 = strftime(fname,0x400,"%Y%m%d",(tm *)&timeinfo);
  if (sVar5 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar8 = std::operator<<(local_668,"strftime failed: \'");
    poVar8 = std::operator<<(poVar8,"\' error: ");
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<(poVar8,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&cname);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  std::operator+(&local_698,&this->m_dir,"/");
  std::operator+(&local_6e0,&local_698,&this->m_prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&local_6e0
                 ,"-");
  std::operator+(&cname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 fname);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_698);
  __lhs = &this->m_fname;
  bVar2 = std::operator!=(__lhs,&cname);
  if (bVar2) {
    if ((FILE *)this->m_fp != (FILE *)0x0) {
      iVar3 = fclose((FILE *)this->m_fp);
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar8 = std::operator<<(local_668,"Cannot close file: \'");
        poVar8 = std::operator<<(poVar8,(string *)__lhs);
        poVar8 = std::operator<<(poVar8,"\' error: ");
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        std::operator<<(poVar8,pcVar10);
        pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar11,&local_6e0);
        __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
      }
      this->m_fp = (FILE *)0x0;
    }
    std::__cxx11::string::_M_assign((string *)__lhs);
    RemoveOld(this);
  }
  if (this->m_fp == (FILE *)0x0) {
    pFVar6 = fopen((this->m_fname)._M_dataplus._M_p,"a");
    this->m_fp = (FILE *)pFVar6;
    if (pFVar6 == (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar8 = std::operator<<(local_668,"Cannot open file: \'");
      poVar8 = std::operator<<(poVar8,(string *)__lhs);
      poVar8 = std::operator<<(poVar8,"\' error: ");
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      std::operator<<(poVar8,pcVar10);
      pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar11,&local_6e0);
      __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
    }
  }
  sVar5 = strftime(buf,0x80,"%F %T",(tm *)&timeinfo);
  if (sVar5 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar8 = std::operator<<(local_668,"strftime failed: \'");
    poVar8 = std::operator<<(poVar8,"\' error: ");
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<(poVar8,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&local_6e0);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  pFVar6 = (FILE *)this->m_fp;
  psVar7 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  uVar4 = getpid();
  iVar3 = fprintf(pFVar6,"%s - %s [PID: %d] - %s\n",buf,pcVar1,(ulong)uVar4,(str->_M_dataplus)._M_p)
  ;
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar8 = std::operator<<(local_668,"failed to write to file \'");
    poVar8 = std::operator<<(poVar8,(string *)__lhs);
    poVar8 = std::operator<<(poVar8,"\' error:");
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<(poVar8,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&local_6e0);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  iVar3 = fflush((FILE *)this->m_fp);
  if (-1 < iVar3) {
    std::__cxx11::string::~string((string *)&cname);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar8 = std::operator<<(local_668,"failed to fflush to file \'");
  poVar8 = std::operator<<(poVar8,(string *)__lhs);
  poVar8 = std::operator<<(poVar8,"\' error:");
  piVar9 = __errno_location();
  pcVar10 = strerror(*piVar9);
  std::operator<<(poVar8,pcVar10);
  pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar11,&local_6e0);
  __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogFileDaily::Log(const LogType Type, const std::string &str)
{
	time_t current = time(NULL);
	struct tm timeinfo;
	char fname[1024];
	char buf[128];

	localtime_r(&current, &timeinfo);

	if (strftime(fname, sizeof(fname), "%Y%m%d", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
	const std::string cname = m_dir + "/" + m_prefix + "-" + fname;

	if (m_fname != cname)
	{
		if (m_fp != NULL)
		{
			if (fclose(m_fp) < 0)
			{
				std::stringstream ss;
				ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
				throw(LogException(ss.str()));
			}
			m_fp = NULL;
		}
		m_fname = cname;
		RemoveOld();
	}

	if (m_fp == NULL)
	{
		m_fp = fopen(m_fname.c_str(), "a");
		if (m_fp == NULL)
		{
			std::stringstream ss;
			ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
	}

	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to fflush to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}